

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

LOs __thiscall Omega_h::compound_maps(Omega_h *this,LOs *a2b,LOs *b2c)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  ulong uVar2;
  uint uVar3;
  LOs LVar4;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Write<int> local_f0;
  Write<int> a2c;
  Write<int> local_d0;
  type f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,(allocator *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_70,
                 ":");
  std::__cxx11::to_string(&local_90,0x94);
  std::operator+(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 &local_90);
  begin_code("compound_maps",local_110._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_70);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
    uVar3 = (uint)(uVar2 >> 2);
  }
  else {
    uVar3 = (uint)((ulong)pAVar1 >> 5);
    uVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_110,"",(allocator *)&f);
  Write<int>::Write(&a2c,(LO)(uVar2 >> 2),&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  Write<int>::Write((Write<int> *)&f,&a2b->write_);
  Write<int>::Write(&f.b2c.write_,&b2c->write_);
  Write<int>::Write(&f.a2c,&a2c);
  std::__cxx11::string::string
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_111);
  std::operator+(&local_70,&local_90,":");
  std::__cxx11::to_string(&local_50,0x54);
  std::operator+(&local_110,&local_70,&local_50);
  begin_code("parallel_for",local_110._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_110,(Write<int> *)&f);
    Write<int>::Write((Write<int> *)&local_110.field_2,&f.b2c.write_);
    Write<int>::Write(&local_f0,&f.a2c);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)local_f0.shared_alloc_.direct_ptr + uVar2 * 4) =
           *(undefined4 *)
            (local_110.field_2._8_8_ + (long)*(int *)(local_110._M_string_length + uVar2 * 4) * 4);
    }
    compound_maps(Omega_h::Read<int>,Omega_h::Read<int>)::$_0::~__0((__0 *)&local_110);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  Write<int>::Write(&local_d0,&a2c);
  Read<int>::Read((Read<signed_char> *)this,&local_d0);
  Write<int>::~Write(&local_d0);
  compound_maps(Omega_h::Read<int>,Omega_h::Read<int>)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&a2c);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  LVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar4.write_.shared_alloc_;
}

Assistant:

LOs compound_maps(LOs a2b, LOs b2c) {
  OMEGA_H_TIME_FUNCTION;
  LO na = a2b.size();
  Write<LO> a2c(a2b.size());
  auto f = OMEGA_H_LAMBDA(LO a) {
    LO b = a2b[a];
    LO c = b2c[b];
    a2c[a] = c;
  };
  parallel_for(na, std::move(f));
  return a2c;
}